

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O0

REF_STATUS ref_import_examine_header(char *filename)

{
  REF_FILEPOS RVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  __off_t _Var5;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  char *yp_1;
  char *xp_1;
  int y_1;
  char *yp;
  char *xp;
  int y;
  REF_BOOL file_position_report;
  int i;
  long i8_swapped;
  long i8;
  int keyword_code;
  int version;
  int i4_swapped;
  int i4;
  REF_FILEPOS end_position;
  REF_FILEPOS next_position;
  FILE *file;
  char *filename_local;
  
  file = (FILE *)filename;
  next_position = (REF_FILEPOS)fopen(filename,"r");
  if ((FILE *)next_position == (FILE *)0x0) {
    printf("unable to open %s\n",file);
  }
  if (next_position == 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x6f1,
           "ref_import_examine_header","unable to open file");
    filename_local._4_4_ = 2;
  }
  else {
    printf(" -- 32bit ugrid header\n");
    rewind((FILE *)next_position);
    for (y = 0; y < 8; y = y + 1) {
      sVar4 = fread(&version,4,1,(FILE *)next_position);
      iVar2 = keyword_code;
      if (sVar4 != 1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x6f8,"ref_import_examine_header","int");
        return 1;
      }
      keyword_code._0_1_ = (undefined1)version;
      xp._7_1_ = (undefined1)keyword_code;
      keyword_code._1_1_ = SUB41(iVar2,1);
      xp._6_1_ = keyword_code._1_1_;
      keyword_code._2_1_ = SUB41(iVar2,2);
      xp._5_1_ = keyword_code._2_1_;
      keyword_code._3_1_ = SUB41(iVar2,3);
      xp._4_1_ = keyword_code._3_1_;
      keyword_code = xp._4_4_;
      printf(" %d: %d (%d swapped) ints\n",(ulong)(uint)y,(ulong)(uint)version,(ulong)xp._4_4_);
    }
    printf(" -- 64bit ugrid header\n");
    rewind((FILE *)next_position);
    for (y = 0; y < 3; y = y + 1) {
      sVar4 = fread(&version,4,1,(FILE *)next_position);
      if (sVar4 != 1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x703,"ref_import_examine_header","int");
        return 1;
      }
    }
    for (y = 3; y < 7; y = y + 1) {
      sVar4 = fread(&i8_swapped,8,1,(FILE *)next_position);
      if (sVar4 != 1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x706,"ref_import_examine_header","long");
        return 1;
      }
      file_position_report._0_1_ = (undefined1)i8_swapped;
      xp_1._7_1_ = (undefined1)file_position_report;
      file_position_report._1_1_ = (undefined1)((ulong)i8_swapped >> 8);
      xp_1._6_1_ = file_position_report._1_1_;
      file_position_report._2_1_ = (undefined1)((ulong)i8_swapped >> 0x10);
      xp_1._5_1_ = file_position_report._2_1_;
      file_position_report._3_1_ = (undefined1)((ulong)i8_swapped >> 0x18);
      xp_1._4_1_ = file_position_report._3_1_;
      printf(" %d: %ld (%ld swapped) long\n",(ulong)(uint)y,i8_swapped,(long)xp_1._4_4_);
    }
    printf(" -- meshb/solb\n");
    rewind((FILE *)next_position);
    printf("%d sizeof(REF_FILEPOS)\n",8);
    iVar2 = fseeko((FILE *)next_position,0,2);
    if ((long)iVar2 == 0) {
      _i4_swapped = ftello((FILE *)next_position);
      rewind((FILE *)next_position);
      sVar4 = fread(&version,4,1,(FILE *)next_position);
      if (sVar4 == 1) {
        printf("%d meshb code\n",(ulong)(uint)version);
        if (version == 1) {
          sVar4 = fread(&version,4,1,(FILE *)next_position);
          if (sVar4 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x71a,"ref_import_examine_header","version",1,sVar4);
            return 1;
          }
          printf("%d version\n",(ulong)(uint)version);
          if ((0 < version) && (version < 5)) {
            i8._4_4_ = version;
            end_position = ftello((FILE *)next_position);
            while (end_position <= _i4_swapped && 0 < end_position) {
              iVar2 = fseeko((FILE *)next_position,end_position,0);
              if ((long)iVar2 != 0) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x720,"ref_import_examine_header","fseeko NEXT failed",0,(long)iVar2);
                return 1;
              }
              sVar4 = fread(&i8,4,1,(FILE *)next_position);
              if (sVar4 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x723,"ref_import_examine_header","keyword code",1,sVar4);
                return 1;
              }
              printf("%d keyword",(ulong)(uint)i8);
              switch((uint)i8) {
              case 3:
                printf(" dimension\n");
                break;
              case 4:
                printf(" vertex\n");
                break;
              case 5:
                printf(" edge P1\n");
                break;
              case 6:
                printf(" triangle P1\n");
                break;
              case 7:
                printf(" quad P1\n");
                break;
              case 8:
                printf(" tetrahedra P1\n");
                break;
              case 9:
                printf(" prism P1\n");
                break;
              case 10:
                printf(" hex P1\n");
                break;
              default:
                printf("\n");
                break;
              case 0x18:
                printf(" triangle P2\n");
                break;
              case 0x19:
                printf(" edge P2\n");
                break;
              case 0x1b:
                printf(" quad P2\n");
                break;
              case 0x1e:
                printf(" tetrahedra P2\n");
                break;
              case 0x21:
                printf(" hex P2\n");
                break;
              case 0x28:
                printf(" geom node assoc\n");
                break;
              case 0x29:
                printf(" geom edge assoc\n");
                break;
              case 0x2a:
                printf(" geom face assoc\n");
                break;
              case 0x31:
                printf(" pyramid P1\n");
                break;
              case 0x36:
                printf(" END\n");
                break;
              case 0x3e:
                printf(" solution at vertices\n");
                break;
              case 0x56:
                printf(" prism P2\n");
                break;
              case 0x57:
                printf(" pyramid P2\n");
                break;
              case 0x5a:
                printf(" triangle P3\n");
                break;
              case 0x5c:
                printf(" edge P3\n");
                break;
              case 0x7e:
                printf(" CAD data\n");
              }
              uVar3 = meshb_pos((FILE *)next_position,i8._4_4_,&end_position);
              RVar1 = end_position;
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x771,"ref_import_examine_header",(ulong)uVar3,"meshb pos");
                return uVar3;
              }
              if (end_position < 1) {
                printf("\n");
              }
              else {
                _Var5 = ftello((FILE *)next_position);
                printf(" %ld size\n",RVar1 - _Var5);
              }
              if ((i8._4_4_ < 4) || ((uint)i8 == 3)) {
                _Var5 = ftello((FILE *)next_position);
                if (_Var5 < _i4_swapped) {
                  sVar4 = fread(&version,4,1,(FILE *)next_position);
                  if (sVar4 != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x77f,"ref_import_examine_header","code",1,sVar4);
                    return 1;
                  }
                  printf("  %d first i4\n",(ulong)(uint)version);
                }
              }
              else {
                _Var5 = ftello((FILE *)next_position);
                if (_Var5 < _i4_swapped) {
                  sVar4 = fread(&i8_swapped,8,1,(FILE *)next_position);
                  if (sVar4 != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x77a,"ref_import_examine_header","code",1,sVar4);
                    return 1;
                  }
                  printf("  %ld first i8\n",i8_swapped);
                }
              }
              _Var5 = ftello((FILE *)next_position);
              if (_Var5 < _i4_swapped) {
                sVar4 = fread(&version,4,1,(FILE *)next_position);
                if (sVar4 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x784,"ref_import_examine_header","code",1,sVar4);
                  return 1;
                }
                printf("  %d second i4\n",(ulong)(uint)version);
              }
            }
          }
        }
        fclose((FILE *)next_position);
        filename_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x717,"ref_import_examine_header","code",1,sVar4);
        filename_local._4_4_ = 1;
      }
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x712,"ref_import_examine_header","fseeko END failed",0,(long)iVar2);
      filename_local._4_4_ = 1;
    }
  }
  return filename_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_import_examine_header(const char *filename) {
  FILE *file;
  REF_FILEPOS next_position, end_position;
  int i4, i4_swapped, version, keyword_code;
  long i8, i8_swapped;
  int i;
  REF_BOOL file_position_report = REF_FALSE;

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  printf(" -- 32bit ugrid header\n");

  rewind(file);

  for (i = 0; i < 8; i++) {
    RES(1, fread(&i4, sizeof(int), 1, file), "int");
    i4_swapped = i4;
    SWAP_INT(i4_swapped);
    printf(" %d: %d (%d swapped) ints\n", i, i4, i4_swapped);
  }

  printf(" -- 64bit ugrid header\n");

  rewind(file);

  for (i = 0; i < 3; i++) {
    RES(1, fread(&i4, sizeof(int), 1, file), "int");
  }
  for (i = 3; i < 7; i++) {
    RES(1, fread(&i8, sizeof(long), 1, file), "long");
    i8_swapped = i8;
    SWAP_INT(i8_swapped);
    printf(" %d: %ld (%ld swapped) long\n", i, i8, i8_swapped);
  }

  printf(" -- meshb/solb\n");

  rewind(file);

  printf("%d sizeof(REF_FILEPOS)\n", (REF_INT)sizeof(REF_FILEPOS));

  REIS(0, fseeko(file, 0, SEEK_END), "fseeko END failed");
  end_position = ftello(file);
  if (file_position_report) printf("%ld end_position\n", (long)end_position);
  rewind(file);

  REIS(1, fread((unsigned char *)&i4, 4, 1, file), "code");
  printf("%d meshb code\n", i4);
  if (1 != i4) goto close_file_and_return;
  REIS(1, fread((unsigned char *)&i4, 4, 1, file), "version");
  printf("%d version\n", i4);
  if (1 > i4 || i4 > 4) goto close_file_and_return;
  version = i4;
  next_position = ftello(file);
  while (next_position <= end_position && 0 < next_position) {
    REIS(0, fseeko(file, next_position, SEEK_SET), "fseeko NEXT failed");
    if (file_position_report)
      printf("%ld current position\n", (long)next_position);
    REIS(1, fread((unsigned char *)&keyword_code, 4, 1, file), "keyword code");
    printf("%d keyword", keyword_code);
    switch (keyword_code) {
      case 3:
        printf(" dimension\n");
        break;
      case 4:
        printf(" vertex\n");
        break;
      case 5:
        printf(" edge P1\n");
        break;
      case 25:
        printf(" edge P2\n");
        break;
      case 92:
        printf(" edge P3\n");
        break;
      case 6:
        printf(" triangle P1\n");
        break;
      case 24:
        printf(" triangle P2\n");
        break;
      case 90:
        printf(" triangle P3\n");
        break;
      case 7:
        printf(" quad P1\n");
        break;
      case 27:
        printf(" quad P2\n");
        break;
      case 8:
        printf(" tetrahedra P1\n");
        break;
      case 49:
        printf(" pyramid P1\n");
        break;
      case 9:
        printf(" prism P1\n");
        break;
      case 10:
        printf(" hex P1\n");
        break;
      case 30:
        printf(" tetrahedra P2\n");
        break;
      case 87:
        printf(" pyramid P2\n");
        break;
      case 86:
        printf(" prism P2\n");
        break;
      case 33:
        printf(" hex P2\n");
        break;
      case 40:
        printf(" geom node assoc\n");
        break;
      case 41:
        printf(" geom edge assoc\n");
        break;
      case 42:
        printf(" geom face assoc\n");
        break;
      case 62:
        printf(" solution at vertices\n");
        break;
      case 126:
        printf(" CAD data\n");
        break;
      case 54:
        printf(" END\n");
        break;
      default:
        printf("\n");
    }
    RSS(meshb_pos(file, version, &next_position), "meshb pos");
    if (file_position_report) printf("%ld next position", (long)next_position);
    if (next_position > 0) {
      printf(" %ld size\n", (long)(next_position - ftello(file)));
    } else {
      printf("\n");
    }
    if (version >= 4 && keyword_code != 3) {
      if (ftello(file) < end_position) {
        REIS(1, fread((unsigned char *)&i8, 8, 1, file), "code");
        printf("  %ld first i8\n", i8);
      }
    } else {
      if (ftello(file) < end_position) {
        REIS(1, fread((unsigned char *)&i4, 4, 1, file), "code");
        printf("  %d first i4\n", i4);
      }
    }
    if (ftello(file) < end_position) {
      REIS(1, fread((unsigned char *)&i4, 4, 1, file), "code");
      printf("  %d second i4\n", i4);
    }
  }

close_file_and_return:
  fclose(file);
  return REF_SUCCESS;
}